

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_NewObjectProtoClass(JSContext *ctx,JSValue proto_val,JSClassID class_id)

{
  JSValueUnion proto;
  JSValueUnion sh;
  JSValueUnion JVar1;
  uint uVar2;
  JSValue JVar3;
  
  proto = proto_val.u;
  if ((int)proto_val.tag != -1) {
    proto.float64 = 0.0;
  }
  uVar2 = (proto._4_4_ + proto.int32 * -0x61c8ffff) * -0x61c8ffff + 0x3c6e0001;
  JVar1 = *(JSValueUnion *)
           &((JSValueUnion *)
            (ctx->rt->shape_hash + (uVar2 >> (-(char)ctx->rt->shape_hash_bits & 0x1fU))))->int32;
  sh.float64 = 0.0;
  if ((JSObject *)JVar1.ptr != (JSObject *)0x0) {
    do {
      if (((*(uint *)((long)JVar1.ptr + 0x1c) == uVar2) &&
          (*(JSObject **)((long)JVar1.ptr + 0x38) == (JSObject *)proto.ptr)) &&
         (sh = JVar1, *(int *)((long)JVar1.ptr + 0x28) == 0)) break;
      JVar1 = *(JSValueUnion *)&((JSValueUnion *)((long)JVar1.ptr + 0x30))->int32;
      sh.float64 = 0.0;
    } while ((JSObject *)JVar1.ptr != (JSObject *)0x0);
  }
  if ((JSObject *)sh.ptr == (JSObject *)0x0) {
    sh.float64 = (double)js_new_shape2(ctx,proto.float64,2,JVar1.int32);
    if ((JSObject *)sh.ptr == (JSObject *)0x0) {
      return (JSValue)(ZEXT816(6) << 0x40);
    }
  }
  else {
    *(int *)sh.ptr = *sh.ptr + 1;
  }
  JVar3 = JS_NewObjectFromShape(ctx,(JSShape *)sh.ptr,class_id);
  return JVar3;
}

Assistant:

JSValue JS_NewObjectProtoClass(JSContext *ctx, JSValueConst proto_val,
                               JSClassID class_id)
{
    JSShape *sh;
    JSObject *proto;

    proto = get_proto_obj(proto_val);
    sh = find_hashed_shape_proto(ctx->rt, proto);
    if (likely(sh)) {
        sh = js_dup_shape(sh);
    } else {
        sh = js_new_shape(ctx, proto);
        if (!sh)
            return JS_EXCEPTION;
    }
    return JS_NewObjectFromShape(ctx, sh, class_id);
}